

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Leaf::loadChildren
          (Leaf *this,LDIterator *children)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 local_50;
  undefined4 local_48;
  char local_44;
  ulong local_40;
  int iStack_38;
  undefined4 uStack_34;
  undefined1 uStack_30;
  undefined3 uStack_2f;
  undefined1 uStack_2c;
  undefined7 uStack_2b;
  undefined4 local_24;
  undefined4 extraout_var;
  
  iVar2 = (*children->_core->_vptr_IteratorCore[2])();
  if ((char)iVar2 != '\0') {
    do {
      iVar2 = (*children->_core->_vptr_IteratorCore[3])();
      puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar2);
      local_44 = *(char *)((long)puVar3 + 0xc);
      if (local_44 == '\0') {
        local_24 = *(undefined4 *)((long)puVar3 + 0x2c);
        local_50 = *puVar3;
        local_48 = *(undefined4 *)(puVar3 + 1);
      }
      else {
        uVar1 = *(undefined8 *)((long)puVar3 + 0x19);
        local_24 = *(undefined4 *)((long)puVar3 + 0x2c);
        local_50 = *puVar3;
        local_48 = *(undefined4 *)(puVar3 + 1);
        uStack_2b = 0;
        local_40 = (ulong)(*(uint5 *)(puVar3 + 2) & 0xffffffff03);
        iStack_38._1_3_ = (uint3)uVar1;
        iStack_38 = (uint)iStack_38._1_3_ << 8;
        uStack_34 = (undefined4)((ulong)uVar1 >> 0x18);
        uStack_30 = (undefined1)((ulong)uVar1 >> 0x38);
        uStack_2f = (undefined3)*(undefined4 *)((long)puVar3 + 0x21);
        uStack_2c = (undefined1)((uint)*(undefined4 *)((long)puVar3 + 0x21) >> 0x18);
      }
      (*(this->super_Node)._vptr_Node[9])(this,&local_50);
      iVar2 = (*children->_core->_vptr_IteratorCore[2])();
    } while ((char)iVar2 != '\0');
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::Leaf::loadChildren(LDIterator children)
{
  while(children.hasNext()) {
    // TODO move instead of copying here
    insert(*children.next());
  }
}